

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr
          (DebugInfoManager *this,Instruction *dbg_declare,Instruction *scope)

{
  uint uVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  DebugScope *pDVar5;
  IRContext *this_00;
  DefUseManager *this_01;
  pointer ppVar6;
  reference puVar7;
  iterator iStack_90;
  uint32_t scope_id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> _Stack_70;
  uint32_t decl_scope_id;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_68;
  iterator dbg_local_var_itr;
  uint32_t local_58;
  uint32_t dbg_local_var_id;
  Instruction *local_50;
  Instruction *value;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> scope_ids;
  Instruction *scope_local;
  Instruction *dbg_declare_local;
  DebugInfoManager *this_local;
  
  scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)scope;
  if (dbg_declare == (Instruction *)0x0) {
    __assert_fail("dbg_declare != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x20f,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  if (scope == (Instruction *)0x0) {
    __assert_fail("scope != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x210,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  OVar3 = opt::Instruction::opcode
                    ((Instruction *)
                     scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (OVar3 == OpPhi) {
    pDVar5 = opt::Instruction::GetDebugScope
                       ((Instruction *)
                        scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    value._4_4_ = DebugScope::GetLexicalScope(pDVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
               (value_type_conflict *)((long)&value + 4));
    for (value._0_4_ = 0; uVar1 = (uint)value,
        uVar4 = opt::Instruction::NumInOperands
                          ((Instruction *)
                           scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar1 < uVar4;
        value._0_4_ = (uint)value + 2) {
      this_00 = context(this);
      this_01 = IRContext::get_def_use_mgr(this_00);
      uVar4 = opt::Instruction::GetSingleWordInOperand
                        ((Instruction *)
                         scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(uint)value);
      local_50 = DefUseManager::GetDef(this_01,uVar4);
      if (local_50 != (Instruction *)0x0) {
        pDVar5 = opt::Instruction::GetDebugScope(local_50);
        dbg_local_var_id = DebugScope::GetLexicalScope(pDVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&dbg_local_var_id);
      }
    }
  }
  else {
    pDVar5 = opt::Instruction::GetDebugScope
                       ((Instruction *)
                        scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_58 = DebugScope::GetLexicalScope(pDVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_58);
  }
  dbg_local_var_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>.
  _M_cur._4_4_ = opt::Instruction::GetSingleWordOperand(dbg_declare,4);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
       ::find(&this->id_to_dbg_inst_,
              (key_type *)
              ((long)&dbg_local_var_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                      ._M_cur + 4));
  _Stack_70._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
       ::end(&this->id_to_dbg_inst_);
  bVar2 = std::__detail::operator!=(&local_68,&stack0xffffffffffffff90);
  if (!bVar2) {
    __assert_fail("dbg_local_var_itr != id_to_dbg_inst_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x222,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  ppVar6 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                         *)&local_68);
  uVar4 = opt::Instruction::GetSingleWordOperand(ppVar6->second,9);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  iStack_90 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff70);
    if (!bVar2) {
      this_local._7_1_ = false;
LAB_0092c60f:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      return this_local._7_1_;
    }
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    if ((*puVar7 != 0) && (bVar2 = IsAncestorOfScope(this,*puVar7,uVar4), bVar2)) {
      this_local._7_1_ = true;
      goto LAB_0092c60f;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

bool DebugInfoManager::IsDeclareVisibleToInstr(Instruction* dbg_declare,
                                               Instruction* scope) {
  assert(dbg_declare != nullptr);
  assert(scope != nullptr);

  std::vector<uint32_t> scope_ids;
  if (scope->opcode() == spv::Op::OpPhi) {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
    for (uint32_t i = 0; i < scope->NumInOperands(); i += 2) {
      auto* value = context()->get_def_use_mgr()->GetDef(
          scope->GetSingleWordInOperand(i));
      if (value != nullptr)
        scope_ids.push_back(value->GetDebugScope().GetLexicalScope());
    }
  } else {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
  }

  uint32_t dbg_local_var_id =
      dbg_declare->GetSingleWordOperand(kDebugDeclareOperandLocalVariableIndex);
  auto dbg_local_var_itr = id_to_dbg_inst_.find(dbg_local_var_id);
  assert(dbg_local_var_itr != id_to_dbg_inst_.end());
  uint32_t decl_scope_id = dbg_local_var_itr->second->GetSingleWordOperand(
      kDebugLocalVariableOperandParentIndex);

  // If the scope of DebugDeclare is an ancestor scope of the instruction's
  // scope, the local variable is visible to the instruction.
  for (uint32_t scope_id : scope_ids) {
    if (scope_id != kNoDebugScope &&
        IsAncestorOfScope(scope_id, decl_scope_id)) {
      return true;
    }
  }
  return false;
}